

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

mg_connection * mg_next(mg_server *s,mg_connection *c)

{
  ns_connection *pnVar1;
  void *pvVar2;
  mg_server *pmVar3;
  mg_connection *pmVar4;
  
  if (c == (mg_connection *)0x0) {
    pmVar3 = (mg_server *)0x0;
  }
  else {
    pmVar3 = (mg_server *)c[-1].callback_param;
  }
  if (pmVar3 != (mg_server *)0x0) {
    s = pmVar3;
  }
  pnVar1 = (s->ns_mgr).active_connections;
  if (pnVar1 != (ns_connection *)0x0) {
    pvVar2 = pnVar1->user_data;
    pmVar4 = (mg_connection *)((long)pvVar2 + 8);
    if (pvVar2 == (void *)0x0) {
      pmVar4 = (mg_connection *)0x0;
    }
    return pmVar4;
  }
  return (mg_connection *)0x0;
}

Assistant:

struct mg_connection *mg_next(struct mg_server *s, struct mg_connection *c) {
  struct ns_connection *nc = ns_next(&s->ns_mgr, c == NULL ? NULL :
                                     MG_CONN_2_CONN(c)->ns_conn);
  if (nc != NULL && nc->user_data != NULL) {
    return & ((struct connection *) nc->user_data)->mg_conn;
  } else {
    return NULL;
  }
}